

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_32x64_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  int left_offset;
  ulong uVar12;
  uint uVar13;
  short sVar14;
  short sVar16;
  undefined1 auVar15 [16];
  short sVar17;
  ushort uVar18;
  ushort uVar19;
  short sVar20;
  ushort uVar21;
  ushort uVar22;
  short sVar23;
  ushort uVar24;
  ushort uVar25;
  short sVar26;
  ushort uVar27;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  ushort uVar31;
  short sVar32;
  ushort uVar33;
  ushort uVar34;
  short sVar35;
  ushort uVar36;
  ushort uVar37;
  short sVar38;
  ushort uVar39;
  ushort uVar40;
  undefined1 auVar41 [16];
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  
  auVar15 = pshuflw(ZEXT116(top_row[0x1f]),ZEXT116(top_row[0x1f]),0);
  sVar14 = auVar15._0_2_;
  sVar16 = auVar15._2_2_;
  for (uVar12 = 0; uVar12 < 0x40; uVar12 = uVar12 + 8) {
    uVar1 = *(ulong *)(left_column + uVar12);
    auVar2._8_6_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2[0xe] = (char)(uVar1 >> 0x38);
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar1;
    auVar3[0xc] = (char)(uVar1 >> 0x30);
    auVar3._13_2_ = auVar2._13_2_;
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar1;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5._8_2_ = 0;
    auVar5._0_8_ = uVar1;
    auVar5[10] = (char)(uVar1 >> 0x28);
    auVar5._11_4_ = auVar4._11_4_;
    auVar6._8_2_ = 0;
    auVar6._0_8_ = uVar1;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = (char)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._9_6_ = auVar6._9_6_;
    auVar9._7_8_ = 0;
    auVar9._0_7_ = auVar7._8_7_;
    auVar10._1_8_ = SUB158(auVar9 << 0x40,7);
    auVar10[0] = (char)(uVar1 >> 0x18);
    auVar10._9_6_ = 0;
    auVar11._1_10_ = SUB1510(auVar10 << 0x30,5);
    auVar11[0] = (char)(uVar1 >> 0x10);
    auVar11._11_4_ = 0;
    auVar8[2] = (char)(uVar1 >> 8);
    auVar8._0_2_ = (ushort)uVar1;
    auVar8._3_12_ = SUB1512(auVar11 << 0x20,3);
    auVar15._0_2_ = (ushort)uVar1 & 0xff;
    auVar15._2_13_ = auVar8._2_13_;
    auVar15[0xf] = 0;
    for (uVar13 = 0x1000100; uVar13 < 0xf0e0f0f; uVar13 = uVar13 + 0x2020202) {
      auVar41._4_4_ = uVar13;
      auVar41._0_4_ = uVar13;
      auVar41._8_4_ = uVar13;
      auVar41._12_4_ = uVar13;
      auVar41 = pshufb(auVar15,auVar41);
      sVar17 = auVar41._0_2_;
      sVar20 = auVar41._2_2_;
      sVar23 = auVar41._4_2_;
      sVar26 = auVar41._6_2_;
      sVar29 = auVar41._8_2_;
      sVar32 = auVar41._10_2_;
      sVar35 = auVar41._12_2_;
      sVar38 = auVar41._14_2_;
      uVar18 = sVar17 * 0xff + sVar14 + 0x80;
      uVar21 = sVar20 * 0xf0 + sVar16 * 0x10 + 0x80;
      uVar24 = sVar23 * 0xe1 + sVar14 * 0x1f + 0x80;
      uVar27 = sVar26 * 0xd2 + sVar16 * 0x2e + 0x80;
      uVar30 = sVar29 * 0xc4 + sVar14 * 0x3c + 0x80;
      uVar33 = sVar32 * 0xb6 + sVar16 * 0x4a + 0x80;
      uVar36 = sVar35 * 0xa9 + sVar14 * 0x57 + 0x80;
      uVar39 = sVar38 * 0x9d + sVar16 * 99 + 0x80;
      uVar42 = sVar17 * 0x91 + sVar14 * 0x6f + 0x80;
      uVar44 = sVar20 * 0x85 + sVar16 * 0x7b + 0x80;
      uVar46 = sVar23 * 0x7a + sVar14 * 0x86 + 0x80;
      uVar48 = sVar26 * 0x6f + sVar16 * 0x91 + 0x80;
      uVar50 = sVar29 * 0x65 + sVar14 * 0x9b + 0x80;
      uVar52 = sVar32 * 0x5c + sVar16 * 0xa4 + 0x80;
      uVar54 = sVar35 * 0x53 + sVar14 * 0xad + 0x80;
      uVar56 = sVar38 * 0x4a + sVar16 * 0xb6 + 0x80;
      uVar19 = uVar18 >> 8;
      uVar22 = uVar21 >> 8;
      uVar25 = uVar24 >> 8;
      uVar28 = uVar27 >> 8;
      uVar31 = uVar30 >> 8;
      uVar34 = uVar33 >> 8;
      uVar37 = uVar36 >> 8;
      uVar40 = uVar39 >> 8;
      uVar43 = uVar42 >> 8;
      uVar45 = uVar44 >> 8;
      uVar47 = uVar46 >> 8;
      uVar49 = uVar48 >> 8;
      uVar51 = uVar50 >> 8;
      uVar53 = uVar52 >> 8;
      uVar55 = uVar54 >> 8;
      uVar57 = uVar56 >> 8;
      *dst = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
      dst[1] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
      dst[2] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
      dst[3] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
      dst[4] = (uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31);
      dst[5] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
      dst[6] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
      dst[7] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      dst[8] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[9] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[10] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
      dst[0xb] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[0xc] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      dst[0xd] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
      dst[0xe] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
      dst[0xf] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
      uVar18 = sVar17 * 0x42 + sVar14 * 0xbe + 0x80;
      uVar21 = sVar20 * 0x3b + sVar16 * 0xc5 + 0x80;
      uVar24 = sVar23 * 0x34 + sVar14 * 0xcc + 0x80;
      uVar27 = sVar26 * 0x2d + sVar16 * 0xd3 + 0x80;
      uVar30 = sVar29 * 0x27 + sVar14 * 0xd9 + 0x80;
      uVar33 = sVar32 * 0x22 + sVar16 * 0xde + 0x80;
      uVar36 = sVar35 * 0x1d + sVar14 * 0xe3 + 0x80;
      uVar39 = sVar38 * 0x19 + sVar16 * 0xe7 + 0x80;
      uVar42 = sVar17 * 0x15 + sVar14 * 0xeb + 0x80;
      uVar44 = sVar20 * 0x11 + sVar16 * 0xef + 0x80;
      uVar46 = sVar23 * 0xe + sVar14 * 0xf2 + 0x80;
      uVar48 = sVar26 * 0xc + sVar16 * 0xf4 + 0x80;
      uVar50 = sVar29 * 10 + sVar14 * 0xf6 + 0x80;
      uVar52 = sVar32 * 9 + sVar16 * 0xf7 + 0x80;
      uVar54 = sVar35 * 8 + sVar14 * 0xf8 + 0x80;
      uVar56 = sVar38 * 8 + sVar16 * 0xf8 + 0x80;
      uVar19 = uVar18 >> 8;
      uVar22 = uVar21 >> 8;
      uVar25 = uVar24 >> 8;
      uVar28 = uVar27 >> 8;
      uVar31 = uVar30 >> 8;
      uVar34 = uVar33 >> 8;
      uVar37 = uVar36 >> 8;
      uVar40 = uVar39 >> 8;
      uVar43 = uVar42 >> 8;
      uVar45 = uVar44 >> 8;
      uVar47 = uVar46 >> 8;
      uVar49 = uVar48 >> 8;
      uVar51 = uVar50 >> 8;
      uVar53 = uVar52 >> 8;
      uVar55 = uVar54 >> 8;
      uVar57 = uVar56 >> 8;
      dst[0x10] = (uVar19 != 0) * (uVar19 < 0x100) * (char)(uVar18 >> 8) - (0xff < uVar19);
      dst[0x11] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
      dst[0x12] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
      dst[0x13] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
      dst[0x14] = (uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31);
      dst[0x15] = (uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar34);
      dst[0x16] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
      dst[0x17] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
      dst[0x18] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
      dst[0x19] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
      dst[0x1a] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
      dst[0x1b] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
      dst[0x1c] = (uVar51 != 0) * (uVar51 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar51);
      dst[0x1d] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
      dst[0x1e] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
      dst[0x1f] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
      dst = dst + stride;
    }
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_32x64_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[31]);
  const __m128i weights_lo = LoadUnaligned16(smooth_weights + 28);
  const __m128i weights_hi = LoadUnaligned16(smooth_weights + 44);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_hi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_hi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int left_offset = 0; left_offset < 64; left_offset += 8) {
    const __m128i left = cvtepu8_epi16(LoadLo8(left_column + left_offset));
    for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
      const __m128i y_select = _mm_set1_epi32(y_mask);
      const __m128i left_y = _mm_shuffle_epi8(left, y_select);
      write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                     scaled_top_right1, scaled_top_right2,
                                     round);
      write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3,
                                     weights4, scaled_top_right3,
                                     scaled_top_right4, round);
      dst += stride;
    }
  }
}